

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert_types.hpp
# Opt level: O0

void __thiscall libtorrent::read_piece_alert::~read_piece_alert(read_piece_alert *this)

{
  read_piece_alert *this_local;
  
  ~read_piece_alert(this);
  operator_delete(this,0x88);
  return;
}

Assistant:

struct TORRENT_EXPORT read_piece_alert final : torrent_alert
	{
		// internal
		read_piece_alert(aux::stack_allocator& alloc, torrent_handle const& h
			, piece_index_t p, boost::shared_array<char> d, int s);
		read_piece_alert(aux::stack_allocator& alloc, torrent_handle h
			, piece_index_t p, error_code e);

		TORRENT_DEFINE_ALERT_PRIO(read_piece_alert, 5, alert_priority_critical)

		static constexpr alert_category_t static_category = alert_category::storage;
		std::string message() const override;

		error_code const error;
		boost::shared_array<char> const buffer;
		piece_index_t const piece;
		int const size;

#if TORRENT_ABI_VERSION == 1
		error_code TORRENT_DEPRECATED_MEMBER ec;
#endif
	}